

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O3

int lls_svd(double *Ai,double *bi,int M,int N,double *xo)

{
  size_t __size;
  int iVar1;
  double *U;
  double *V;
  double *q;
  double *C;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  
  lVar6 = (long)N;
  U = (double *)malloc(M * lVar6 * 8);
  __size = lVar6 * 8;
  V = (double *)malloc(__size * lVar6);
  q = (double *)malloc(__size);
  C = (double *)malloc(__size);
  dVar7 = macheps();
  iVar1 = svd(Ai,M,N,U,V,q);
  if (iVar1 == 0) {
    mmult(bi,U,C,1,M,N);
    if (0 < N) {
      uVar2 = (ulong)(uint)N;
      uVar5 = 0;
      pdVar3 = V;
      do {
        uVar4 = 0;
        do {
          if (ABS(q[uVar4]) <= dVar7) {
            pdVar3[uVar4] = 0.0;
          }
          else {
            pdVar3[uVar4] = pdVar3[uVar4] / q[uVar4];
          }
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
        uVar5 = uVar5 + 1;
        pdVar3 = pdVar3 + uVar2;
      } while (uVar5 != uVar2);
    }
    mmult(V,C,xo,N,N,1);
    free(U);
    free(V);
    free(q);
  }
  return iVar1;
}

Assistant:

int lls_svd(double *Ai,double *bi,int M,int N,double *xo) {
	int retcode,i,j,t;
	double *U,*V,*q,*C;
	double eps;

	U = (double*) malloc(sizeof(double) * M*N);
	V = (double*) malloc(sizeof(double) * N*N);
	q = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N);

	retcode = 0;
	eps = macheps();

	retcode = svd(Ai,M,N,U,V,q);;
	if (retcode != 0) {
		return retcode;
	}

	mmult(bi,U,C,1,M,N);

	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (fabs(q[j]) > eps) {
				V[t+j] /= q[j];
			} else {
				V[t+j] = 0.0;
			}
		}
	}

	mmult(V,C,xo,N,N,1);

	free(U);
	free(V);
	free(q);

	return retcode;
}